

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_set_engine_default(Curl_easy *data)

{
  int iVar1;
  char *pcVar2;
  Curl_easy *data_local;
  
  if ((data->state).engine != (void *)0x0) {
    iVar1 = ENGINE_set_default((ENGINE *)(data->state).engine,0xffff);
    if (iVar1 < 1) {
      pcVar2 = ENGINE_get_id((ENGINE *)(data->state).engine);
      Curl_failf(data,"set default crypto engine \'%s\' failed",pcVar2);
      return CURLE_SSL_ENGINE_SETFAILED;
    }
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      pcVar2 = ENGINE_get_id((ENGINE *)(data->state).engine);
      Curl_infof(data,"set default crypto engine \'%s\'",pcVar2);
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_set_engine_default(struct Curl_easy *data)
{
#ifdef USE_OPENSSL_ENGINE
  if(data->state.engine) {
    if(ENGINE_set_default(data->state.engine, ENGINE_METHOD_ALL) > 0) {
      infof(data, "set default crypto engine '%s'",
            ENGINE_get_id(data->state.engine));
    }
    else {
      failf(data, "set default crypto engine '%s' failed",
            ENGINE_get_id(data->state.engine));
      return CURLE_SSL_ENGINE_SETFAILED;
    }
  }
#else
  (void) data;
#endif
  return CURLE_OK;
}